

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.cpp
# Opt level: O2

void device_init(char *cfg)

{
  embree::TutorialData_Constructor((TutorialData *)embree::data);
  embree::g_scene = embree::convertScene((ISPCScene *)embree::data._16_8_);
  embree::data._0_8_ = embree::g_scene;
  embree::data._8_8_ = rtcGetSceneTraversable(embree::g_scene);
  return;
}

Assistant:

void device_init (char* cfg)
{
  TutorialData_Constructor(&data);
  
  /* create scene */
  g_scene = data.scene = convertScene(data.ispc_scene);
  data.traversable = rtcGetSceneTraversable(data.scene);
}